

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:773:28)>
::getImpl(SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:773:28)>
          *this,ExceptionOrValue *output)

{
  Promise<int> PVar1;
  ExceptionOr<kj::_::Void> depResult;
  NullableValue<kj::Exception> local_350;
  char local_1b8;
  ExceptionOr<kj::Promise<int>_> local_1b0;
  
  local_350.isSet = false;
  local_1b8 = '\0';
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)&local_350);
  if (local_350.isSet == true) {
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_1b0,&local_350.field_1.value);
    local_1b0.value.ptr.isSet = false;
    ExceptionOr<kj::Promise<int>_>::operator=((ExceptionOr<kj::Promise<int>_> *)output,&local_1b0);
    ExceptionOr<kj::Promise<int>_>::~ExceptionOr(&local_1b0);
  }
  else if (local_1b8 == '\x01') {
    PVar1 = anon_class_1_0_00000001_for_func::operator()((anon_class_1_0_00000001_for_func *)this);
    ExceptionOr<kj::Promise<int>_>::~ExceptionOr(&local_1b0);
    NullableValue<kj::Exception>::~NullableValue(&local_350);
    _Unwind_Resume(PVar1.super_PromiseBase.node.ptr);
  }
  NullableValue<kj::Exception>::~NullableValue(&local_350);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }